

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

int __thiscall
QMdiSubWindowPrivate::titleBarHeight(QMdiSubWindowPrivate *this,QStyleOptionTitleBar *options)

{
  bool bVar1;
  Int IVar2;
  int iVar3;
  QWidget *this_00;
  QStyle *pQVar4;
  undefined8 in_RSI;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  int height;
  QMdiSubWindow *q;
  undefined4 in_stack_ffffffffffffffb8;
  WindowType in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  WindowType WVar5;
  undefined4 in_stack_ffffffffffffffcc;
  int local_14;
  QFlagsStorageHelper<Qt::WindowType,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &q_func(in_RDI)->super_QWidget;
  WVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffffc8);
  if (*(long *)&(in_RDI->super_QWidgetPrivate).field_0x10 != 0) {
    QWidget::windowFlags((QWidget *)in_RDI);
    local_c.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)
         QFlags<Qt::WindowType>::operator&
                   ((QFlags<Qt::WindowType> *)in_RDI,in_stack_ffffffffffffffbc);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
    WVar5 = CONCAT13(1,(int3)WVar5);
    if (IVar2 == 0) {
      bVar1 = QWidget::isMaximized(this_00);
      in_stack_ffffffffffffffbc =
           in_stack_ffffffffffffffbc &
           (NoTitleBarBackgroundHint|ExpandedClientAreaHint|WindowDoesNotAcceptFocus|
            WindowOverridesSystemGestures|WindowTransparentForInput|WindowStaysOnTopHint|
            WindowShadeButtonHint|WindowContextHelpButtonHint|WindowMinMaxButtonsHint|
            WindowSystemMenuHint|WindowTitleHint|FramelessWindowHint|BypassWindowManagerHint|
            MSWindowsOwnDC|MSWindowsFixedSizeDialogHint|WindowType_Mask);
      if (bVar1) {
        bVar1 = drawTitleBarWhenMaximized
                          ((QMdiSubWindowPrivate *)CONCAT44(in_stack_ffffffffffffffcc,WVar5));
        in_stack_ffffffffffffffbc =
             CONCAT13(bVar1,(int3)in_stack_ffffffffffffffbc) ^
             ~(NoTitleBarBackgroundHint|ExpandedClientAreaHint|WindowDoesNotAcceptFocus|
               WindowOverridesSystemGestures|WindowTransparentForInput|WindowStaysOnTopHint|
               WindowShadeButtonHint|WindowContextHelpButtonHint|WindowMinMaxButtonsHint|
               WindowSystemMenuHint|WindowTitleHint|FramelessWindowHint|BypassWindowManagerHint|
               MSWindowsOwnDC|MSWindowsFixedSizeDialogHint|WindowType_Mask);
      }
      WVar5 = in_stack_ffffffffffffffbc &
              ~(NoTitleBarBackgroundHint|ExpandedClientAreaHint|WindowDoesNotAcceptFocus|
                WindowOverridesSystemGestures|WindowTransparentForInput|WindowStaysOnTopHint|
                WindowShadeButtonHint|WindowContextHelpButtonHint|WindowMinMaxButtonsHint|
                WindowSystemMenuHint|WindowTitleHint|FramelessWindowHint|BypassWindowManagerHint|
                MSWindowsOwnDC|MSWindowsFixedSizeDialogHint|WindowType_Mask);
    }
  }
  if ((WVar5 & ~(WindowFullscreenButtonHint|NoDropShadowWindowHint|BypassGraphicsProxyWidget|
                 MacWindowToolBarButtonHint|WindowCloseButtonHint|WindowStaysOnBottomHint|
                 CustomizeWindowHint|NoTitleBarBackgroundHint|ExpandedClientAreaHint|
                 WindowDoesNotAcceptFocus|WindowOverridesSystemGestures|WindowTransparentForInput|
                 WindowStaysOnTopHint|WindowShadeButtonHint|WindowContextHelpButtonHint|
                 WindowMinMaxButtonsHint|WindowSystemMenuHint|WindowTitleHint|FramelessWindowHint|
                 BypassWindowManagerHint|MSWindowsOwnDC|MSWindowsFixedSizeDialogHint|WindowType_Mask
                )) == Widget) {
    pQVar4 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                           );
    local_14 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x1a,in_RSI,this_00);
    bVar1 = hasBorder(in_RDI,(QStyleOptionTitleBar *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (bVar1) {
      bVar1 = QWidget::isMinimized(this_00);
      iVar3 = 4;
      if (bVar1) {
        iVar3 = 8;
      }
      local_14 = iVar3 + local_14;
    }
  }
  else {
    local_14 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_14;
}

Assistant:

int QMdiSubWindowPrivate::titleBarHeight(const QStyleOptionTitleBar &options) const
{
    Q_Q(const QMdiSubWindow);
    if (!parent || q->windowFlags() & Qt::FramelessWindowHint
        || (q->isMaximized() && !drawTitleBarWhenMaximized())) {
        return 0;
    }

    int height = q->style()->pixelMetric(QStyle::PM_TitleBarHeight, &options, q);
    if (hasBorder(options))
        height += q->isMinimized() ? 8 : 4;
    return height;
}